

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_listener_base.cpp
# Opt level: O3

int __thiscall zmq::stream_listener_base_t::close(stream_listener_base_t *this,int __fd)

{
  socket_base_t *this_00;
  int iVar1;
  int __fd_00;
  endpoint_uri_pair_t local_68;
  
  __fd_00 = this->_s;
  if (this->_s == -1) {
    close((stream_listener_base_t *)&this->_s,(int)&local_68);
    __fd_00 = (int)local_68.local._M_dataplus._M_p;
  }
  iVar1 = ::close(__fd_00);
  if (iVar1 != 0) {
    close(__fd_00);
  }
  this_00 = this->_socket;
  make_unconnected_bind_endpoint_pair(&local_68,&this->_endpoint);
  socket_base_t::event_closed(this_00,&local_68,this->_s);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.remote._M_dataplus._M_p != &local_68.remote.field_2) {
    operator_delete(local_68.remote._M_dataplus._M_p,
                    local_68.remote.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_68.local._M_dataplus._M_p._4_4_,(int)local_68.local._M_dataplus._M_p) !=
      &local_68.local.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_68.local._M_dataplus._M_p._4_4_,
                             (int)local_68.local._M_dataplus._M_p),
                    local_68.local.field_2._M_allocated_capacity + 1);
  }
  this->_s = -1;
  return 0;
}

Assistant:

int zmq::stream_listener_base_t::close ()
{
    // TODO this is identical to stream_connector_base_t::close

    zmq_assert (_s != retired_fd);
#ifdef ZMQ_HAVE_WINDOWS
    const int rc = closesocket (_s);
    wsa_assert (rc != SOCKET_ERROR);
#else
    const int rc = ::close (_s);
    errno_assert (rc == 0);
#endif
    _socket->event_closed (make_unconnected_bind_endpoint_pair (_endpoint), _s);
    _s = retired_fd;

    return 0;
}